

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deSTLUtil.hpp
# Opt level: O3

mapped_type *
de::
lookup<std::map<std::__cxx11::string,de::SharedPtr<unsigned_char>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,de::SharedPtr<unsigned_char>>>>>
          (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
           *map,key_type *key)

{
  const_iterator cVar1;
  out_of_range *this;
  
  cVar1 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
          ::find(&map->_M_t,key);
  if ((_Rb_tree_header *)cVar1._M_node != &(map->_M_t)._M_impl.super__Rb_tree_header) {
    return (mapped_type *)(cVar1._M_node + 2);
  }
  this = (out_of_range *)__cxa_allocate_exception(0x10);
  std::out_of_range::out_of_range(this,"key not found in map");
  __cxa_throw(this,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
}

Assistant:

const typename M::mapped_type& lookup (const M& map, const typename M::key_type& key)
{
	const typename M::mapped_type* ptr = tryLookup(map, key);
	if (ptr == DE_NULL)
		throw std::out_of_range("key not found in map");
	return *ptr;
}